

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::IsAttributeSet
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyAttributes attr,BOOL *isNumericPropertyId)

{
  BOOL BVar1;
  undefined8 in_RAX;
  uint32 local_24 [2];
  uint32 index;
  
  local_24[0] = (uint32)((ulong)in_RAX >> 0x20);
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_24);
  *isNumericPropertyId = BVar1;
  if (BVar1 == 0) {
    BVar1 = 1;
  }
  else {
    BVar1 = IsAttributeSet(this,local_24[0],attr);
  }
  return BVar1;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsAttributeSet(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attr, BOOL& isNumericPropertyId)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        uint32 index;
        isNumericPropertyId = scriptContext->IsNumericPropertyId(propertyId, &index);
        if (isNumericPropertyId)
        {
            return IsAttributeSet(index, attr);
        }

        return true;
    }